

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
cfd::core::RandomNumberUtil::GetRandomIndexes
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          uint32_t length)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  _Rb_tree_color _Var7;
  size_t __i;
  long lVar8;
  _Base_ptr p_Var9;
  uint32_t index;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  uniform_int_distribution<int> dist;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exist_value;
  _Rb_tree_color local_6c [2];
  uint32_t local_64;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  if ((GetRandomIndexes(unsigned_int)::rd == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetRandomIndexes(unsigned_int)::rd), iVar4 != 0)) {
    std::random_device::random_device(&GetRandomIndexes::rd);
    __cxa_atexit(std::random_device::~random_device,&GetRandomIndexes::rd,&__dso_handle);
    __cxa_guard_release(&GetRandomIndexes(unsigned_int)::rd);
  }
  if ((GetRandomIndexes(unsigned_int)::engine == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetRandomIndexes(unsigned_int)::engine), iVar4 != 0)) {
    uVar5 = ::std::random_device::_M_getval();
    uVar6 = (ulong)uVar5;
    lVar8 = 1;
    GetRandomIndexes::engine._M_x[0] = uVar6;
    do {
      uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar8);
      GetRandomIndexes::engine._M_x[lVar8] = uVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x270);
    GetRandomIndexes::engine._M_p = 0x270;
    __cxa_guard_release(&GetRandomIndexes(unsigned_int)::engine);
  }
  local_6c[1] = 0;
  local_64 = length;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)length,(allocator_type *)&local_60);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (length != 0) {
    if (length == 1) {
      *(__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_start = 0;
    }
    else {
      uVar6 = 0;
      do {
        local_6c[0] = ::std::uniform_int_distribution<int>::operator()
                                (local_6c + 1,&GetRandomIndexes::engine,(param_type *)(local_6c + 1)
                                );
        if (length <= local_6c[0]) {
          local_6c[0] = local_6c[0] / length;
        }
        p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var1->_M_header;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0 ||
            local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00303bca:
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_start[uVar6] = local_6c[0];
          ::std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_60,local_6c);
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        else {
          do {
            p_Var10 = p_Var11;
            p_Var9 = p_Var12;
            _Var7 = p_Var9[1]._M_color;
            p_Var11 = p_Var9;
            if (_Var7 < local_6c[0]) {
              p_Var11 = p_Var10;
            }
            p_Var12 = (&p_Var9->_M_left)[_Var7 < local_6c[0]];
          } while ((&p_Var9->_M_left)[_Var7 < local_6c[0]] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var11 == p_Var1) goto LAB_00303bca;
          if (_Var7 < local_6c[0]) {
            p_Var9 = p_Var10;
          }
          if (local_6c[0] < p_Var9[1]._M_color) goto LAB_00303bca;
        }
      } while ((uint)uVar6 < length - 1);
      if (length != 0) {
        _Var7 = _S_red;
        do {
          p_Var12 = &p_Var1->_M_header;
          p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          _Var3 = _S_red;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00303c4a:
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_start[length - 1] = _Var3;
            break;
          }
          do {
            p_Var9 = p_Var11;
            p_Var10 = p_Var12;
            _Var2 = p_Var9[1]._M_color;
            p_Var12 = p_Var9;
            if (_Var2 < _Var7) {
              p_Var12 = p_Var10;
            }
            p_Var11 = (&p_Var9->_M_left)[_Var2 < _Var7];
          } while ((&p_Var9->_M_left)[_Var2 < _Var7] != (_Base_ptr)0x0);
          _Var3 = _Var7;
          if ((_Rb_tree_header *)p_Var12 == p_Var1) goto LAB_00303c4a;
          if (_Var2 < _Var7) {
            p_Var9 = p_Var10;
          }
          if (_Var7 < p_Var9[1]._M_color) goto LAB_00303c4a;
          _Var7 = _Var7 + _S_black;
        } while (_Var7 != length);
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> RandomNumberUtil::GetRandomIndexes(uint32_t length) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  std::uniform_int_distribution<> dist(0, length);
  std::vector<uint32_t> result(length);
  std::set<uint32_t> exist_value;
  uint32_t value;

  if (length == 1) {
    result[0] = 0;
  } else if (length > 1) {
    uint32_t index = 0;
    while (index < (length - 1)) {
      value = dist(engine);
      if (value >= length) {
        value /= length;
      }
      if ((exist_value.empty()) || (exist_value.count(value) == 0)) {  // MSVC
        result[index] = value;
        exist_value.insert(value);
        ++index;
      }
    }

    for (value = 0; value < length; ++value) {
      if (exist_value.count(value) == 0) {
        result[length - 1] = value;
        break;
      }
    }
  }

  return result;
}